

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crl.cc
# Opt level: O0

bool __thiscall bssl::ParseCrlTbsCertList(bssl *this,Input tbs_tlv,ParsedCrlTbsCertList *out)

{
  Input input;
  bool bVar1;
  Span<const_unsigned_char> *pSVar2;
  undefined1 local_e8 [8];
  Input revoked_certificates_tlv;
  undefined1 local_d0 [4];
  CBS_ASN1_TAG maybe_revoked_certifigates_tag;
  Input unused_revoked_certificates;
  GeneralizedTime local_b8;
  GeneralizedTime next_update_time;
  Input unused_next_update_input;
  CBS_ASN1_TAG maybe_next_update_tag;
  uint64_t local_88;
  uint64_t version64;
  optional<bssl::der::Input> version_der;
  Parser tbs_parser;
  undefined1 local_40 [8];
  Parser parser;
  ParsedCrlTbsCertList *out_local;
  Input tbs_tlv_local;
  
  parser.advance_len_ = tbs_tlv.data_.size_;
  input.data_.size_ = (size_t)tbs_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser((Parser *)local_40,input);
  der::Parser::Parser((Parser *)
                      &version_der.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                       super__Optional_payload_base<bssl::der::Input>._M_engaged);
  bVar1 = der::Parser::ReadSequence
                    ((Parser *)local_40,
                     (Parser *)
                     &version_der.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                      super__Optional_payload_base<bssl::der::Input>._M_engaged);
  if (bVar1) {
    ::std::optional<bssl::der::Input>::optional((optional<bssl::der::Input> *)&version64);
    bVar1 = der::Parser::ReadOptionalTag
                      ((Parser *)
                       &version_der.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                        super__Optional_payload_base<bssl::der::Input>._M_engaged,2,
                       (optional<bssl::der::Input> *)&version64);
    if (bVar1) {
      bVar1 = ::std::optional<bssl::der::Input>::has_value((optional<bssl::der::Input> *)&version64)
      ;
      if (bVar1) {
        pSVar2 = &::std::optional<bssl::der::Input>::operator*
                            ((optional<bssl::der::Input> *)&version64)->data_;
        bVar1 = der::ParseUint64((Input)*pSVar2,&local_88);
        if (!bVar1) {
          return false;
        }
        if (local_88 != 1) {
          return false;
        }
        *(undefined4 *)parser.advance_len_ = 1;
      }
      else {
        *(undefined4 *)parser.advance_len_ = 0;
      }
      bVar1 = der::Parser::ReadRawTLV
                        ((Parser *)
                         &version_der.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                          super__Optional_payload_base<bssl::der::Input>._M_engaged,
                         (Input *)(parser.advance_len_ + 8));
      if (bVar1) {
        bVar1 = der::Parser::ReadRawTLV
                          ((Parser *)
                           &version_der.super__Optional_base<bssl::der::Input,_true,_true>.
                            _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged,
                           (Input *)(parser.advance_len_ + 0x18));
        if (bVar1) {
          bVar1 = ReadUTCOrGeneralizedTime
                            ((Parser *)
                             &version_der.super__Optional_base<bssl::der::Input,_true,_true>.
                              _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged,
                             (GeneralizedTime *)(parser.advance_len_ + 0x28));
          if (bVar1) {
            der::Input::Input((Input *)&next_update_time);
            bVar1 = der::Parser::PeekTagAndValue
                              ((Parser *)
                               &version_der.super__Optional_base<bssl::der::Input,_true,_true>.
                                _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged
                               ,(CBS_ASN1_TAG *)((long)&unused_next_update_input.data_.size_ + 4),
                               (Input *)&next_update_time);
            if ((bVar1) &&
               ((unused_next_update_input.data_.size_._4_4_ == 0x17 ||
                (unused_next_update_input.data_.size_._4_4_ == 0x18)))) {
              bVar1 = ReadUTCOrGeneralizedTime
                                ((Parser *)
                                 &version_der.super__Optional_base<bssl::der::Input,_true,_true>.
                                  _M_payload.super__Optional_payload_base<bssl::der::Input>.
                                  _M_engaged,&local_b8);
              if (!bVar1) {
                return false;
              }
              ::std::optional<bssl::der::GeneralizedTime>::operator=
                        ((optional<bssl::der::GeneralizedTime> *)(parser.advance_len_ + 0x30),
                         &local_b8);
            }
            else {
              ::std::optional<bssl::der::GeneralizedTime>::operator=
                        ((optional<bssl::der::GeneralizedTime> *)(parser.advance_len_ + 0x30));
            }
            der::Input::Input((Input *)local_d0);
            bVar1 = der::Parser::PeekTagAndValue
                              ((Parser *)
                               &version_der.super__Optional_base<bssl::der::Input,_true,_true>.
                                _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged
                               ,(CBS_ASN1_TAG *)((long)&revoked_certificates_tlv.data_.size_ + 4),
                               (Input *)local_d0);
            if ((bVar1) && (revoked_certificates_tlv.data_.size_._4_4_ == 0x20000010)) {
              der::Input::Input((Input *)local_e8);
              bVar1 = der::Parser::ReadRawTLV
                                ((Parser *)
                                 &version_der.super__Optional_base<bssl::der::Input,_true,_true>.
                                  _M_payload.super__Optional_payload_base<bssl::der::Input>.
                                  _M_engaged,(Input *)local_e8);
              if (!bVar1) {
                return false;
              }
              ::std::optional<bssl::der::Input>::operator=
                        ((optional<bssl::der::Input> *)(parser.advance_len_ + 0x40),
                         (Input *)local_e8);
            }
            else {
              ::std::optional<bssl::der::Input>::operator=
                        ((optional<bssl::der::Input> *)(parser.advance_len_ + 0x40));
            }
            bVar1 = der::Parser::ReadOptionalTag
                              ((Parser *)
                               &version_der.super__Optional_base<bssl::der::Input,_true,_true>.
                                _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged
                               ,0xa0000000,
                               (optional<bssl::der::Input> *)(parser.advance_len_ + 0x58));
            if (bVar1) {
              bVar1 = ::std::optional<bssl::der::Input>::has_value
                                ((optional<bssl::der::Input> *)(parser.advance_len_ + 0x58));
              if ((bVar1) && (*(int *)parser.advance_len_ != 1)) {
                tbs_tlv_local.data_.size_._7_1_ = false;
              }
              else {
                bVar1 = der::Parser::HasMore
                                  ((Parser *)
                                   &version_der.super__Optional_base<bssl::der::Input,_true,_true>.
                                    _M_payload.super__Optional_payload_base<bssl::der::Input>.
                                    _M_engaged);
                if (bVar1) {
                  tbs_tlv_local.data_.size_._7_1_ = false;
                }
                else {
                  bVar1 = der::Parser::HasMore((Parser *)local_40);
                  if (bVar1) {
                    tbs_tlv_local.data_.size_._7_1_ = false;
                  }
                  else {
                    tbs_tlv_local.data_.size_._7_1_ = true;
                  }
                }
              }
            }
            else {
              tbs_tlv_local.data_.size_._7_1_ = false;
            }
          }
          else {
            tbs_tlv_local.data_.size_._7_1_ = false;
          }
        }
        else {
          tbs_tlv_local.data_.size_._7_1_ = false;
        }
      }
      else {
        tbs_tlv_local.data_.size_._7_1_ = false;
      }
    }
    else {
      tbs_tlv_local.data_.size_._7_1_ = false;
    }
  }
  else {
    tbs_tlv_local.data_.size_._7_1_ = false;
  }
  return tbs_tlv_local.data_.size_._7_1_;
}

Assistant:

bool ParseCrlTbsCertList(der::Input tbs_tlv, ParsedCrlTbsCertList *out) {
  der::Parser parser(tbs_tlv);

  //   TBSCertList  ::=  SEQUENCE  {
  der::Parser tbs_parser;
  if (!parser.ReadSequence(&tbs_parser)) {
    return false;
  }

  //         version                 Version OPTIONAL,
  //                                      -- if present, MUST be v2
  std::optional<der::Input> version_der;
  if (!tbs_parser.ReadOptionalTag(CBS_ASN1_INTEGER, &version_der)) {
    return false;
  }
  if (version_der.has_value()) {
    uint64_t version64;
    if (!der::ParseUint64(*version_der, &version64)) {
      return false;
    }
    // If version is present, it MUST be v2(1).
    if (version64 != 1) {
      return false;
    }
    out->version = CrlVersion::V2;
  } else {
    // Uh, RFC 5280 doesn't actually say it anywhere, but presumably if version
    // is not specified, it is V1.
    out->version = CrlVersion::V1;
  }

  //         signature               AlgorithmIdentifier,
  if (!tbs_parser.ReadRawTLV(&out->signature_algorithm_tlv)) {
    return false;
  }

  //         issuer                  Name,
  if (!tbs_parser.ReadRawTLV(&out->issuer_tlv)) {
    return false;
  }

  //         thisUpdate              Time,
  if (!ReadUTCOrGeneralizedTime(&tbs_parser, &out->this_update)) {
    return false;
  }

  //         nextUpdate              Time OPTIONAL,
  CBS_ASN1_TAG maybe_next_update_tag;
  der::Input unused_next_update_input;
  if (tbs_parser.PeekTagAndValue(&maybe_next_update_tag,
                                 &unused_next_update_input) &&
      (maybe_next_update_tag == CBS_ASN1_UTCTIME ||
       maybe_next_update_tag == CBS_ASN1_GENERALIZEDTIME)) {
    der::GeneralizedTime next_update_time;
    if (!ReadUTCOrGeneralizedTime(&tbs_parser, &next_update_time)) {
      return false;
    }
    out->next_update = next_update_time;
  } else {
    out->next_update = std::nullopt;
  }

  //         revokedCertificates     SEQUENCE OF SEQUENCE  { ... } OPTIONAL,
  der::Input unused_revoked_certificates;
  CBS_ASN1_TAG maybe_revoked_certifigates_tag;
  if (tbs_parser.PeekTagAndValue(&maybe_revoked_certifigates_tag,
                                 &unused_revoked_certificates) &&
      maybe_revoked_certifigates_tag == CBS_ASN1_SEQUENCE) {
    der::Input revoked_certificates_tlv;
    if (!tbs_parser.ReadRawTLV(&revoked_certificates_tlv)) {
      return false;
    }
    out->revoked_certificates_tlv = revoked_certificates_tlv;
  } else {
    out->revoked_certificates_tlv = std::nullopt;
  }

  //         crlExtensions           [0]  EXPLICIT Extensions OPTIONAL
  //                                       -- if present, version MUST be v2
  if (!tbs_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0,
          &out->crl_extensions_tlv)) {
    return false;
  }
  if (out->crl_extensions_tlv.has_value()) {
    if (out->version != CrlVersion::V2) {
      return false;
    }
  }

  if (tbs_parser.HasMore()) {
    // Invalid or extraneous elements.
    return false;
  }

  // By definition the input was a single sequence, so there shouldn't be
  // unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  return true;
}